

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2d.hpp
# Opt level: O2

void remora::bindings::
     im2mat<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::row_major,remora::cpu_tag,remora::cpu_tag>>
               (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *images,matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
                        *output,size_t num_channels,size_t image_height,size_t image_width,
               size_t filter_height,size_t filter_width)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  
  lVar4 = (image_height - filter_height) + 1;
  lVar1 = (image_width - filter_width) + 1;
  lVar3 = *(long *)images;
  lVar2 = num_channels * 8;
  lVar11 = image_width * num_channels * 8;
  lVar18 = 0;
  local_c0 = 0;
  for (lVar8 = 0; lVar8 != lVar3; lVar8 = lVar8 + 1) {
    local_b8 = 0;
    local_b0 = local_c0;
    for (lVar13 = 0; lVar13 != lVar4; lVar13 = lVar13 + 1) {
      local_a8 = 0;
      lVar17 = local_b8;
      for (sVar14 = 0; sVar14 != filter_height; sVar14 = sVar14 + 1) {
        lVar10 = local_b0;
        lVar16 = lVar17;
        for (lVar6 = 0; lVar6 != lVar1; lVar6 = lVar6 + 1) {
          lVar15 = lVar16;
          lVar19 = local_a8;
          for (sVar12 = 0; lVar5 = lVar19, sVar7 = num_channels, lVar9 = lVar15,
              sVar12 != filter_width; sVar12 = sVar12 + 1) {
            while (sVar7 != 0) {
              *(undefined8 *)(lVar5 + *(long *)(output + 0x18) * lVar10 + *(long *)output) =
                   *(undefined8 *)
                    (lVar9 + *(long *)(images + 8) * lVar18 + *(long *)(images + 0x10));
              lVar5 = lVar5 + 8;
              sVar7 = sVar7 - 1;
              lVar9 = lVar9 + 8;
            }
            lVar19 = lVar19 + lVar2;
            lVar15 = lVar15 + lVar2;
          }
          lVar10 = lVar10 + 8;
          lVar16 = lVar16 + lVar2;
        }
        local_a8 = local_a8 + filter_width * num_channels * 8;
        lVar17 = lVar17 + lVar11;
      }
      local_b0 = local_b0 + (image_width - filter_width) * 8 + 8;
      local_b8 = local_b8 + lVar11;
    }
    local_c0 = local_c0 + lVar1 * lVar4 * 8;
    lVar18 = lVar18 + 8;
  }
  return;
}

Assistant:

void im2mat(
	matrix_expression<E1, cpu_tag> const& images,
	matrix_expression<E2, cpu_tag>& output,
	std::size_t num_channels,
	std::size_t image_height,
	std::size_t image_width,
	std::size_t filter_height,
	std::size_t filter_width
){
	static_assert(std::is_same<typename E1::orientation, row_major>::value, "Column major not implemented");
	static_assert(std::is_same<typename E2::orientation, row_major>::value, "Column major not implemented");
	std::size_t rows_per_image = (image_height - filter_height +1) * (image_width - filter_width +1);
	//the order of loops is chosen such, that only very little changes of rows are performed
	for(std::size_t im = 0; im != images().size1(); ++im){
		for(std::size_t i = 0; i != image_height - filter_height +1; ++i){// iterate over row-positions in the image
			for(std::size_t i1 = 0; i1 != filter_height; ++i1){//iterate over the the rows of the current filter
				for(std::size_t j = 0; j != image_width - filter_width +1; ++j){//iterate over the column-position in the image
					std::size_t row_start = im * rows_per_image + i * (image_width - filter_width +1) + j;
					for(std::size_t j1 = 0; j1 != filter_width; ++j1){
						std::size_t col_start = (i1 * filter_width + j1) * num_channels;
						std::size_t image_start = ((i+i1) * image_width + j+j1) * num_channels;
						for(std::size_t c = 0; c != num_channels; ++c){//iterate over the channels
							output()(row_start, col_start + c) = images()(im,image_start + c);
						}
					}
				}
			}
		}
	}
}